

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

void lj_snap_shrink(jit_State *J)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  BCReg maxslot;
  BCReg BVar4;
  SnapShot *pSVar5;
  SnapEntry *pSVar6;
  BCReg BVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint8_t udf [257];
  uint8_t local_138 [264];
  
  pSVar5 = (J->cur).snap;
  uVar2 = (J->cur).nsnap;
  uVar3 = pSVar5[(ulong)uVar2 - 1].mapofs;
  pSVar6 = (J->cur).snapmap;
  bVar1 = pSVar5[(ulong)uVar2 - 1].nent;
  uVar13 = (ulong)bVar1;
  maxslot = J->maxslot;
  BVar4 = J->baseslot;
  BVar7 = snap_usedef(J,local_138,(BCIns *)(*(ulong *)(pSVar6 + uVar3 + uVar13) >> 8),maxslot);
  if (BVar7 < maxslot) {
    snap_useuv(J->pt,local_138);
  }
  pSVar5[(ulong)uVar2 - 1].nslots = (uint8_t)(maxslot + BVar4);
  if (bVar1 == 0) {
    uVar10 = ~uVar3 + (J->cur).nsnapmap;
    uVar8 = 0;
  }
  else {
    uVar9 = 0;
    uVar8 = 0;
    do {
      uVar10 = pSVar6[uVar3 + uVar9] >> 0x18;
      if ((uVar10 < BVar7 + BVar4) ||
         ((uVar10 < maxslot + BVar4 && (local_138[uVar10 - BVar4] == '\0')))) {
        uVar11 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        pSVar6[uVar3 + uVar11] = pSVar6[uVar3 + uVar9];
      }
      uVar9 = uVar9 + 1;
    } while (uVar13 != uVar9);
    uVar12 = pSVar5[(ulong)uVar2 - 1].mapofs;
    pSVar5[(ulong)uVar2 - 1].nent = (uint8_t)uVar8;
    uVar10 = ~uVar12 + (J->cur).nsnapmap;
    if (uVar10 < bVar1) goto LAB_0012c705;
  }
  do {
    uVar12 = (int)uVar13 + 1;
    uVar9 = (ulong)uVar8;
    uVar8 = uVar8 + 1;
    pSVar6[uVar3 + uVar9] = pSVar6[uVar3 + uVar13];
    uVar13 = (ulong)uVar12;
  } while (uVar12 <= uVar10);
  uVar12 = pSVar5[(ulong)uVar2 - 1].mapofs;
LAB_0012c705:
  (J->cur).nsnapmap = uVar12 + uVar8;
  return;
}

Assistant:

void lj_snap_shrink(jit_State *J)
{
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  SnapEntry *map = &J->cur.snapmap[snap->mapofs];
  MSize n, m, nlim, nent = snap->nent;
  uint8_t udf[SNAP_USEDEF_SLOTS];
  BCReg maxslot = J->maxslot;
  BCReg baseslot = J->baseslot;
  BCReg minslot = snap_usedef(J, udf, snap_pc(&map[nent]), maxslot);
  if (minslot < maxslot) snap_useuv(J->pt, udf);
  maxslot += baseslot;
  minslot += baseslot;
  snap->nslots = (uint8_t)maxslot;
  for (n = m = 0; n < nent; n++) {  /* Remove unused slots from snapshot. */
    BCReg s = snap_slot(map[n]);
    if (s < minslot || (s < maxslot && udf[s-baseslot] == 0))
      map[m++] = map[n];  /* Only copy used slots. */
  }
  snap->nent = (uint8_t)m;
  nlim = J->cur.nsnapmap - snap->mapofs - 1;
  while (n <= nlim) map[m++] = map[n++];  /* Move PC + frame links down. */
  J->cur.nsnapmap = (uint32_t)(snap->mapofs + m);  /* Free up space in map. */
}